

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

bool __thiscall
QGraphicsTextItemPrivate::_q_mouseOnEdge
          (QGraphicsTextItemPrivate *this,QGraphicsSceneMouseEvent *event)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  QPainterPath docPath;
  QPainterPath path;
  QPointF local_a8;
  double local_98;
  double dStack_90;
  undefined1 local_80 [16];
  double dStack_70;
  double local_68;
  double dStack_60;
  undefined1 local_50 [8];
  undefined1 *local_48;
  undefined1 *puStack_40;
  qreal local_38;
  
  local_38 = *(qreal *)(in_FS_OFFSET + 0x28);
  local_50 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)local_50);
  (**(code **)(*(long *)&this->qq->super_QGraphicsObject + 0x60))(local_80 + 8);
  QPainterPath::addRect((QRectF *)local_50);
  local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)local_80);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document((QWidgetTextControl *)this->control);
  QTextDocument::rootFrame();
  QTextFrame::frameFormat((QTextFrame *)&local_48);
  (**(code **)(*(long *)&this->qq->super_QGraphicsObject + 0x60))(&local_a8);
  dVar2 = (double)QTextFrameFormat::leftMargin();
  dVar3 = (double)QTextFrameFormat::topMargin();
  dVar4 = (double)QTextFrameFormat::rightMargin();
  dVar5 = (double)QTextFrameFormat::bottomMargin();
  dStack_70 = local_a8.yp + dVar3;
  local_80._8_8_ = local_a8.xp + dVar2;
  local_68 = (local_98 - dVar4) - dVar2;
  dStack_60 = (dStack_90 - dVar5) - dVar3;
  QPainterPath::addRect((QRectF *)local_80);
  QPainterPath::subtracted((QPainterPath *)&local_a8);
  join_0x00001240_0x00001200_ = QGraphicsSceneMouseEvent::pos(event);
  uVar1 = QPainterPath::contains(&local_a8);
  QPainterPath::~QPainterPath((QPainterPath *)&local_a8);
  QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  QPainterPath::~QPainterPath((QPainterPath *)local_80);
  QPainterPath::~QPainterPath((QPainterPath *)local_50);
  if (*(qreal *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsTextItemPrivate::_q_mouseOnEdge(QGraphicsSceneMouseEvent *event)
{
    QPainterPath path;
    path.addRect(qq->boundingRect());

    QPainterPath docPath;
    const QTextFrameFormat format = control->document()->rootFrame()->frameFormat();
    docPath.addRect(
        qq->boundingRect().adjusted(
            format.leftMargin(),
            format.topMargin(),
            -format.rightMargin(),
            -format.bottomMargin()));

    return path.subtracted(docPath).contains(event->pos());
}